

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void MultiplicationHelper<unsigned_short,long_long,9>::
     MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *t,longlong *u,unsigned_short *ret)

{
  uint32_t tmp;
  int64_t u1;
  uint32_t local_1c;
  longlong local_18;
  
  local_18 = *u;
  local_1c = 0;
  LargeIntRegMultiply<unsigned_int,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((uint)*t,&local_18,&local_1c);
  SafeCastHelper<unsigned_short,unsigned_int,2>::
  CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>(local_1c,ret);
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(const T& t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isInt64, "U must be Int64");
        std::int64_t          u1 = u;
        std::uint32_t tmp = 0;

        LargeIntRegMultiply< std::uint32_t, std::int64_t >::template RegMultiplyThrow< E >( (std::uint32_t)t, u1, &tmp );
        SafeCastHelper< T, std::uint32_t, GetCastMethod< T, std::uint32_t >::method >::template CastThrow< E >(tmp, ret);
    }